

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_Dsd6DecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  ulong uVar1;
  Dau_Dsd_t *p_00;
  int iVar2;
  word wVar3;
  word wVar4;
  ulong uVar5;
  abctime aVar6;
  byte bVar7;
  char (*pacVar8) [32];
  uint v;
  int iVar;
  word wVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  word *pwVar13;
  char local_68 [16];
  ulong local_58;
  ulong local_50;
  Dau_Dsd_t *local_48;
  abctime local_40;
  char (*local_38) [32];
  
  local_40 = Abc_Clock();
  local_38 = p->Cache;
  pacVar8 = local_38;
  local_48 = p;
LAB_00433f56:
  do {
    uVar10 = (ulong)(uint)nVars;
    uVar5 = (ulong)(uint)nVars;
    while( true ) {
      uVar1 = uVar5 - 1;
      if ((int)uVar5 < 2) break;
      uVar12 = uVar1 & 0xffffffff;
      pwVar13 = pTruth;
      local_50 = uVar1;
      for (v = (int)uVar5 - 2; uVar5 = local_50, pTruth = pwVar13, -1 < (int)v; v = v - 1) {
        if (pacVar8[pVars[uVar12]][pVars[v]] == '\0') {
          local_68[8] = '\0';
          local_68[9] = '\0';
          local_68[0] = '\0';
          local_68[1] = '\0';
          local_68[2] = '\0';
          local_68[3] = '\0';
          local_68[4] = '\0';
          local_68[5] = '\0';
          local_68[6] = '\0';
          local_68[7] = '\0';
          iVar = (int)local_50;
          local_58 = uVar10;
          wVar3 = Abc_Tt6Cofactor0(*pwVar13,iVar);
          wVar4 = Abc_Tt6Cofactor1(*pwVar13,iVar);
          iVar2 = Dau_Dsd6FindSupportOne(local_48,wVar3,wVar4,pVars,iVar,v,(int)pTruth);
          if (iVar <= (int)v) {
            __assert_fail("v > u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                          ,0x4ef,
                          "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                         );
          }
          bVar7 = (byte)v;
          nVars = (int)local_58;
          uVar11 = nVars;
          if (iVar2 == 1) {
            if ((s_Truths6Neg[v] & (wVar4 >> ((byte)(1 << (bVar7 & 0x1f)) & 0x3f) ^ wVar3)) == 0) {
              sprintf(local_68,"(!%c%c)",(ulong)(pVars[uVar12] + 0x61),(ulong)(pVars[v] + 0x61));
              wVar9 = s_Truths6[v];
              wVar4 = wVar3;
LAB_00434243:
              uVar5 = Abc_Tt6Cofactor1(wVar4,v);
              goto LAB_0043424a;
            }
            if ((s_Truths6[v] & (wVar4 ^ wVar3)) != 0) goto LAB_004342f8;
            sprintf(local_68,"(!%c!%c)",(ulong)(pVars[uVar12] + 0x61),(ulong)(pVars[v] + 0x61));
            uVar5 = s_Truths6[v];
            wVar3 = Abc_Tt6Cofactor0(wVar3,v);
            uVar10 = s_Truths6[v];
            wVar4 = Abc_Tt6Cofactor1(wVar4,v);
            wVar4 = wVar4 & ~uVar10 | wVar3 & uVar5;
LAB_0043426e:
            *pTruth = wVar4;
LAB_00434275:
            p_00 = local_48;
            if (local_68[0] == '\0') {
              __assert_fail("pBuffer[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x520,
                            "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                           );
            }
            iVar2 = Dau_DsdAddVarDef(local_48,local_68);
            pVars[v] = iVar2;
            uVar11 = (uint)local_58;
            nVars = uVar11 - 1;
            pVars[uVar12] = pVars[(long)(int)uVar11 + -1];
            pwVar13 = pTruth;
            Abc_TtSwapVars(pTruth,uVar11,(int)local_50,nVars);
            iVar2 = Dau_Dsd6DecomposeSingleVarOne(p_00,pTruth,pVars,nVars,v);
            pTruth = pwVar13;
            if (iVar2 != 0) {
              nVars = Dau_Dsd6DecomposeSingleVar(local_48,pwVar13,pVars,uVar11 - 2);
              uVar11 = (uint)local_58;
              pTruth = pwVar13;
            }
          }
          else {
            if (iVar2 == 2) {
              if ((s_Truths6Neg[v] & (wVar4 ^ wVar3)) == 0) {
                sprintf(local_68,"(%c%c)",(ulong)(pVars[uVar12] + 0x61),(ulong)(pVars[v] + 0x61));
                wVar9 = s_Truths6[v];
                goto LAB_00434243;
              }
              if ((s_Truths6Neg[v] & (wVar4 >> ((byte)(1 << (bVar7 & 0x1f)) & 0x3f) ^ wVar3)) != 0)
              goto LAB_004342f8;
              sprintf(local_68,"(%c!%c)",(ulong)(pVars[uVar12] + 0x61),(ulong)(pVars[v] + 0x61));
              wVar9 = s_Truths6[v];
              uVar5 = Abc_Tt6Cofactor0(wVar4,v);
LAB_0043424a:
              uVar10 = s_Truths6[v];
              wVar4 = Abc_Tt6Cofactor0(wVar3,v);
              wVar4 = wVar4 & ~uVar10 | uVar5 & wVar9;
              goto LAB_0043426e;
            }
            if (iVar2 == 3) {
              bVar7 = (byte)(1 << (bVar7 & 0x1f));
              if (((s_Truths6Neg[v] & (wVar4 >> (bVar7 & 0x3f) ^ wVar3)) != 0) ||
                 ((s_Truths6Neg[v] & (wVar4 ^ wVar3 >> (bVar7 & 0x3f))) != 0)) goto LAB_004342f8;
              uVar5 = s_Truths6[v];
              wVar4 = Abc_Tt6Cofactor1(wVar3,v);
              uVar10 = s_Truths6[v];
              wVar3 = Abc_Tt6Cofactor0(wVar3,v);
              *pTruth = wVar3 & ~uVar10 | wVar4 & uVar5;
              sprintf(local_68,"[%c%c]",(ulong)(pVars[uVar12] + 0x61),(ulong)(pVars[v] + 0x61));
              goto LAB_00434275;
            }
          }
LAB_004342f8:
          if (nVars == 0) {
            uVar10 = 0;
            goto LAB_0043432f;
          }
          pacVar8 = local_38;
          if (nVars < (int)uVar11) goto LAB_00433f56;
        }
        else {
          nVars = (int)uVar10;
        }
        uVar10 = (ulong)(uint)nVars;
        pwVar13 = pTruth;
      }
    }
    nVars = (int)uVar10;
    if ((int)uVar1 == 0) {
LAB_0043432f:
      aVar6 = Abc_Clock();
      s_Times_1 = s_Times_1 + (aVar6 - local_40);
      return (int)uVar10;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_Dsd6DecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}